

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

string * __thiscall pbrt::CloudMediumProvider::ToString_abi_cxx11_(CloudMediumProvider *this)

{
  string *in_RDI;
  float *in_stack_00000010;
  float *in_stack_00000018;
  Bounds3<float> *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::Bounds3<float>const&,float_const&,float_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,(float *)this);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ CloudMediumProvider bounds: %s density: %f "
                            "wispiness: %f extent: %f ]",
                            bounds, density, wispiness, extent);
    }